

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input_buffer.hh
# Opt level: O2

bool __thiscall
dtc::input_buffer::consume_char_literal(input_buffer *this,unsigned_long_long *outInt)

{
  int iVar1;
  uint uVar2;
  byte bVar3;
  uint uVar4;
  unsigned_long_long uStack_8;
  
  iVar1 = this->size;
  uVar2 = this->cursor;
  if ((int)uVar2 < 0 || iVar1 <= (int)uVar2) {
    bVar3 = 0;
  }
  else {
    bVar3 = this->buffer[uVar2];
  }
  *outInt = (ulong)bVar3;
  uVar4 = uVar2 + 1;
  this->cursor = uVar4;
  if (bVar3 == 0x5c) {
    if ((int)uVar4 < iVar1) {
      if (-2 < (int)uVar2) {
        bVar3 = this->buffer[uVar4];
        *outInt = (ulong)bVar3;
        this->cursor = uVar2 + 2;
        if (bVar3 == 0x27) {
          return true;
        }
        if (bVar3 == 0x30) {
          uStack_8 = 0;
        }
        else {
          if (bVar3 == 0x5c) {
            return true;
          }
          if (bVar3 == 0x6e) {
            uStack_8 = 10;
          }
          else if (bVar3 == 0x74) {
            uStack_8 = 9;
          }
          else {
            if (bVar3 != 0x72) {
              return false;
            }
            uStack_8 = 0xd;
          }
        }
        *outInt = uStack_8;
        return true;
      }
      *outInt = 0;
      this->cursor = uVar2 + 2;
    }
    return false;
  }
  return true;
}

Assistant:

inline char operator[](int offset)
	{
		if (cursor + offset >= size) { return '\0'; }
		if (cursor + offset < 0) { return '\0'; }
		return buffer[cursor + offset];
	}